

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Bac_ManWriteBlifNtk(FILE *pFile,Bac_Ntk_t *p)

{
  char *pcVar1;
  
  if ((p->vFanin).nSize == (p->vType).nSize) {
    pcVar1 = Bac_NtkName(p);
    fprintf((FILE *)pFile,".model %s\n",pcVar1);
    fwrite(".inputs",7,1,(FILE *)pFile);
    Bac_ManWriteBlifArray(pFile,p,&p->vInputs,-1);
    fwrite(".outputs",8,1,(FILE *)pFile);
    Bac_ManWriteBlifArray(pFile,p,&p->vOutputs,-1);
    Bac_ManWriteBlifLines(pFile,p);
    fwrite(".end\n\n",6,1,(FILE *)pFile);
    return;
  }
  __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteBlif.c"
                ,0xc2,"void Bac_ManWriteBlifNtk(FILE *, Bac_Ntk_t *)");
}

Assistant:

void Bac_ManWriteBlifNtk( FILE * pFile, Bac_Ntk_t * p )
{
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
    // write header
    fprintf( pFile, ".model %s\n", Bac_NtkName(p) );
    fprintf( pFile, ".inputs" );
    Bac_ManWriteBlifArray( pFile, p, &p->vInputs, -1 );
    fprintf( pFile, ".outputs" );
    Bac_ManWriteBlifArray( pFile, p, &p->vOutputs, -1 );
    // write objects
    Bac_ManWriteBlifLines( pFile, p );
    fprintf( pFile, ".end\n\n" );
}